

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

void __thiscall cornerstone::buffer::put(buffer *this,string *str)

{
  uint uVar1;
  long lVar2;
  overflow_error *this_00;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  size_t i;
  ulong uVar6;
  
  uVar1 = *(uint *)this;
  uVar5 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar5 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar3 = *(uint *)(this + 4);
  }
  else {
    uVar3 = uVar1 >> 0x10;
  }
  uVar4 = str->_M_string_length;
  if (uVar4 + 1 <= (ulong)(uVar5 & uVar1) - (ulong)uVar3) {
    if ((int)uVar1 < 0) {
      lVar2 = (ulong)*(uint *)(this + 4) + 8;
    }
    else {
      lVar2 = (ulong)(uVar1 >> 0x10) + 4;
    }
    for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      (this + lVar2)[uVar6] = *(buffer *)((str->_M_dataplus)._M_p + uVar6);
      uVar4 = str->_M_string_length;
    }
    (this + lVar2)[uVar4] = (buffer)0x0;
    if (*(int *)this < 0) {
      *(int *)(this + 4) = (int)str->_M_string_length + *(int *)(this + 4) + 1;
    }
    else {
      *(short *)(this + 2) = (short)((uint)*(int *)this >> 0x10) + (short)str->_M_string_length + 1;
    }
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"insufficient buffer to store a string");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

size_t buffer::size() const
{
    return (size_t)(__size_of_block(this));
}